

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_d3d56.cc
# Opt level: O1

void __thiscall hwtest::pgraph::MthdD3D56TlvRhw::~MthdD3D56TlvRhw(MthdD3D56TlvRhw *this)

{
  pointer pcVar1;
  
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test._vptr_Test
       = (_func_int **)&PTR__SingleMthdTest_00348698;
  pcVar1 = (this->super_SingleMthdTest).name._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->super_SingleMthdTest).name.field_2) {
    operator_delete(pcVar1);
  }
  operator_delete(this);
  return;
}

Assistant:

void emulate_mthd() override {
		exp.d3d56_tlv_rhw = val & ~0x3f;
		if (extr(exp.debug_c, 9, 1) && chipset.chipset >= 5) {
			if (extr(exp.d3d56_tlv_rhw, 0, 31) < 0xa800000)
				insrt(exp.d3d56_tlv_rhw, 0, 31, 0xa800000);
		}
		insrt(exp.valid[1], 2, 1, 1);
		int vidx = (cls == 0x48 ? extr(exp.d3d56_tlv_fog_tri_col1, 0, 4) : idx);
		insrt(exp.valid[0], vidx, 1, 0);
	}